

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_storage.cpp
# Opt level: O2

int __thiscall
libtorrent::dht::anon_unknown_0::dht_default_storage::get_infohashes_sample
          (dht_default_storage *this,entry *item)

{
  uint uVar1;
  size_t sVar2;
  entry *peVar3;
  time_point tVar4;
  _Base_ptr p_Var5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  ulong v;
  pointer pdVar10;
  string_view key;
  string_view key_00;
  string_view key_01;
  span<const_char> v_00;
  
  uVar9 = this->m_settings->sample_infohashes_interval;
  if (0x545f < (int)uVar9) {
    uVar9 = 0x5460;
  }
  v = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    v = 0;
  }
  key.len_ = 8;
  key.ptr_ = "interval";
  peVar3 = entry::operator[](item,key);
  entry::operator=(peVar3,v);
  sVar2 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  key_00.len_ = 3;
  key_00.ptr_ = "num";
  peVar3 = entry::operator[](item,key_00);
  entry::operator=(peVar3,(long)(int)sVar2);
  tVar4 = aux::time_now();
  uVar9 = this->m_settings->sample_infohashes_interval;
  uVar7 = this->m_settings->max_infohashes_sample_count;
  uVar6 = 0x14;
  if ((int)uVar7 < 0x14) {
    uVar6 = uVar7;
  }
  if ((int)uVar6 < 1) {
    uVar6 = 0;
  }
  uVar7 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if ((int)uVar6 < (int)uVar7) {
    uVar7 = uVar6;
  }
  if (0 < (int)uVar9) {
    uVar1 = 0x5460;
    if (uVar9 < 0x5460) {
      uVar1 = uVar9;
    }
    if ((long)tVar4.__d.__r <
        (long)((ulong)uVar1 * 1000000000 + (this->m_infohashes_sample).created.__d.__r)) {
      pdVar10 = (this->m_infohashes_sample).samples.
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar8 = (long)(this->m_infohashes_sample).samples.
                    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    .
                    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar10;
      if ((int)uVar6 <= (int)(lVar8 / 0x14)) goto LAB_002f9544;
    }
  }
  pdVar10 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_infohashes_sample).samples.
      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pdVar10) {
    (this->m_infohashes_sample).samples.
    super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pdVar10;
  }
  aux::
  container_wrapper<libtorrent::digest32<160l>,int,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
  ::reserve<int,void>((container_wrapper<libtorrent::digest32<160l>,int,std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>>
                       *)&this->m_infohashes_sample,uVar7);
  uVar9 = (uint)(this->m_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  p_Var5 = (this->m_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (((_Rb_tree_header *)p_Var5 != &(this->m_map)._M_t._M_impl.super__Rb_tree_header &&
         (uVar7 != 0))) {
    lVar8 = random((libtorrent *)(ulong)uVar9);
    if ((uint)lVar8 <= uVar7) {
      std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
      push_back((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
                &this->m_infohashes_sample,(value_type *)(p_Var5 + 1));
      uVar7 = uVar7 - 1;
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    uVar9 = uVar9 - 1;
  }
  (this->m_infohashes_sample).created.__d.__r = (rep)tVar4.__d.__r;
  pdVar10 = (this->m_infohashes_sample).samples.
            super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>.
            super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar8 = (long)(this->m_infohashes_sample).samples.
                super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                .
                super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar10;
LAB_002f9544:
  key_01.len_ = 7;
  key_01.ptr_ = "samples";
  peVar3 = entry::operator[](item,key_01);
  v_00.m_len = lVar8;
  v_00.m_ptr = (char *)pdVar10;
  entry::operator=(peVar3,v_00);
  return (int)(((long)(this->m_infohashes_sample).samples.
                      super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      .
                      super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_infohashes_sample).samples.
                     super_vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     .
                     super__Vector_base<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x14);
}

Assistant:

int get_infohashes_sample(entry& item) override
		{
			item["interval"] = aux::clamp(m_settings.sample_infohashes_interval
				, 0, sample_infohashes_interval_max);
			item["num"] = int(m_map.size());

			refresh_infohashes_sample();

			aux::vector<sha1_hash> const& samples = m_infohashes_sample.samples;
			item["samples"] = span<char const>(
				reinterpret_cast<char const*>(samples.data()), static_cast<std::ptrdiff_t>(samples.size()) * 20);

			return m_infohashes_sample.count();
		}